

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O1

string * __thiscall
camp::BadType::typeName_abi_cxx11_(string *__return_storage_ptr__,BadType *this,Type type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "none";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "boolean";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "integer";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "real";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "string";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "enum";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "array";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "user";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BadType::typeName(Type type)
{
    switch (type)
    {
        case noType:     return "none";
        case boolType:   return "boolean";
        case intType:    return "integer";
        case realType:   return "real";
        case stringType: return "string";
        case enumType:   return "enum";
        case arrayType:  return "array";
        case userType:   return "user";
        default:         return "unknown";
    }
}